

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void Frequent_BenchCmp<4u>(string *PATH)

{
  Abstract<4U> *this;
  bool bVar1;
  undefined1 auVar2 [32];
  char cVar3;
  undefined8 uVar4;
  undefined1 auVar5 [64];
  int iVar6;
  int iVar7;
  value_type *__val;
  Data<4U> *pDVar8;
  ostream *poVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  WavingSketch<8U,_1U,_4U> *this_00;
  WavingSketch<8U,_16U,_4U> *this_01;
  SS<4U> *this_02;
  USS<4U> *this_03;
  Count_Heap<4U> *this_04;
  LdSketchWrapper<4U> *this_05;
  ofstream *poVar12;
  long *plVar13;
  long *plVar14;
  uint32_t i;
  uint uVar15;
  long lVar16;
  int j;
  long lVar17;
  pointer ppbVar18;
  ulong uVar19;
  uint32_t _SIZE;
  basic_ostream<char,_std::char_traits<char>_> **out;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  *__node_gen;
  Data<4U> *__k;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  count_type cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  string file;
  HashMap<4U> mp;
  Abstract<4U> *sketches [6] [6];
  int local_28c;
  long *local_288 [2];
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  undefined1 local_228 [16];
  pointer local_218;
  int local_204;
  long local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  Data<4U> *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  float local_1a8;
  undefined4 uStack_1a4;
  undefined1 auStack_1a0 [16];
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_190;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  local_158 [5];
  long local_130 [32];
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchCmp\n\x1b[0m");
  local_28c = 0;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"caida","");
  pDVar8 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&local_28c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total ",6);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," items",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_1c8._0_8_ = auStack_1a0 + 8;
  local_1c8._8_8_ = 1;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = 1.0;
  auStack_1a0 = (undefined1  [16])0x0;
  if (0 < local_28c) {
    lVar16 = 0;
    __k = pDVar8;
    do {
      iVar10 = std::
               _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1c8,__k);
      if (iVar10.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        pmVar11 = std::__detail::
                  _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_1c8,__k);
        *pmVar11 = 1;
      }
      else {
        pmVar11 = std::__detail::
                  _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_1c8,__k);
        *pmVar11 = *pmVar11 + 1;
      }
      lVar16 = lVar16 + 1;
      __k = __k + 1;
    } while (lVar16 < local_28c);
  }
  local_158[0]._M_h = (__hashtable_alloc *)&local_190;
  local_190._M_buckets = (__buckets_ptr)0x0;
  local_190._M_bucket_count = local_1c8._8_8_;
  local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_190._M_rehash_policy._4_4_ = uStack_1a4;
  local_190._M_rehash_policy._M_max_load_factor = local_1a8;
  local_190._M_element_count = local_1b8._8_8_;
  local_190._M_rehash_policy._M_next_resize = auStack_1a0._0_8_;
  local_190._M_single_bucket = (__node_base_ptr)0x0;
  __node_gen = local_158;
  std::
  _Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<4u>const,int>,true>>>>
            ((_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_158[0]._M_h,
             (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)local_1c8,__node_gen);
  local_1d8 = pDVar8;
  iVar6 = Get_TopK<4u>((HashMap<4U> *)&local_190,2000);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_190);
  uVar20 = 30000;
  _SIZE = 500;
  plVar13 = local_130;
  do {
    this_00 = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
    iVar7 = (int)uVar20;
    WavingSketch<8U,_1U,_4U>::WavingSketch(this_00,(iVar7 + 20000U) / 0x42);
    plVar13[-5] = (long)this_00;
    this_01 = (WavingSketch<8U,_16U,_4U> *)operator_new(0xa8);
    WavingSketch<8U,_16U,_4U>::WavingSketch(this_01,(iVar7 + 20000U) / 0x60);
    plVar13[-4] = (long)this_01;
    this_02 = (SS<4U> *)operator_new(0x78);
    SS<4U>::SS(this_02,_SIZE);
    plVar13[-3] = (long)this_02;
    this_03 = (USS<4U> *)operator_new(0x78);
    USS<4U>::USS(this_03,_SIZE);
    plVar13[-2] = (long)this_03;
    this_04 = (Count_Heap<4U> *)operator_new(0x88);
    Count_Heap<4U>::Count_Heap(this_04,0x9c4,(uint32_t)(uVar20 / 0xc),3);
    plVar13[-1] = (long)this_04;
    this_05 = (LdSketchWrapper<4U> *)operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper(this_05,iVar7 + 20000,iVar6);
    *plVar13 = (long)this_05;
    plVar13 = plVar13 + 6;
    uVar20 = uVar20 + 50000;
    _SIZE = _SIZE + 500;
  } while (uVar20 != 330000);
  local_228 = (undefined1  [16])0x0;
  local_218 = (pointer)0x0;
  local_228._0_8_ = operator_new(0x20);
  local_218 = (pointer)(local_228._0_8_ + 0x20);
  *(undefined8 *)local_228._0_8_ = 0;
  *(undefined8 *)(local_228._0_8_ + 8) = 0;
  *(undefined8 *)(local_228._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_228._0_8_ + 0x18) = 0;
  local_228._8_8_ = local_218;
  poVar12 = (ofstream *)operator_new(0x200);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_288);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)local_288,(ulong)local_1f8[0]);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_258 = *plVar14;
    lStack_250 = plVar13[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar14;
    local_268 = (long *)*plVar13;
  }
  local_260 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_238 = *plVar14;
    lStack_230 = plVar13[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar14;
    local_248 = (long *)*plVar13;
  }
  local_240 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(poVar12,(string *)&local_248,_S_out);
  *(ofstream **)local_228._0_8_ = poVar12;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  poVar12 = (ofstream *)operator_new(0x200);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_288);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)local_288,(ulong)local_1f8[0]);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_258 = *plVar14;
    lStack_250 = plVar13[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar14;
    local_268 = (long *)*plVar13;
  }
  local_260 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_238 = *plVar14;
    lStack_230 = plVar13[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar14;
    local_248 = (long *)*plVar13;
  }
  local_240 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(poVar12,(string *)&local_248,_S_out);
  *(ofstream **)(local_228._0_8_ + 8) = poVar12;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  poVar12 = (ofstream *)operator_new(0x200);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_288);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)local_288,(ulong)local_1f8[0]);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_258 = *plVar14;
    lStack_250 = plVar13[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar14;
    local_268 = (long *)*plVar13;
  }
  local_260 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_238 = *plVar14;
    lStack_230 = plVar13[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar14;
    local_248 = (long *)*plVar13;
  }
  local_240 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(poVar12,(string *)&local_248,_S_out);
  *(ofstream **)(local_228._0_8_ + 0x10) = poVar12;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  poVar12 = (ofstream *)operator_new(0x200);
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_288);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)local_288,(ulong)local_1f8[0]);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_258 = *plVar14;
    lStack_250 = plVar13[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar14;
    local_268 = (long *)*plVar13;
  }
  local_260 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar14 = plVar13 + 2;
  if ((long *)*plVar13 == plVar14) {
    local_238 = *plVar14;
    lStack_230 = plVar13[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar14;
    local_248 = (long *)*plVar13;
  }
  local_240 = plVar13[1];
  *plVar13 = (long)plVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(poVar12,(string *)&local_248,_S_out);
  *(ofstream **)(local_228._0_8_ + 0x18) = poVar12;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  uVar4 = local_228._8_8_;
  for (ppbVar18 = (pointer)local_228._0_8_; ppbVar18 != (pointer)uVar4; ppbVar18 = ppbVar18 + 1) {
    poVar9 = (ostream *)*ppbVar18;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"MEM(KB)",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    lVar16 = 0;
    do {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)*ppbVar18,*(char **)(local_158[lVar16]._M_h + 8),
                          *(long *)(local_158[lVar16]._M_h + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    cVar3 = (char)*ppbVar18;
    std::ios::widen((char)*(undefined8 *)(*(long *)*ppbVar18 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  local_1d0 = 0;
  local_204 = iVar6;
  do {
    uVar15 = (int)(local_1d0 + 1) * 0x32;
    local_200 = local_1d0;
    local_1d0 = local_1d0 + 1;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar15);
    uVar4 = local_228._8_8_;
    for (ppbVar18 = (pointer)local_228._0_8_; ppbVar18 != (pointer)uVar4; ppbVar18 = ppbVar18 + 1) {
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar18,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    }
    local_200 = local_130[local_200 * 6];
    plVar13 = *(long **)(local_200 + 0x70);
    iVar6 = *(int *)((long)plVar13 + 0xc) * (int)plVar13[1];
    if (0 < iVar6) {
      uVar20 = (ulong)(iVar6 + 3U & 0xfffffffc);
      auVar26 = vpbroadcastq_avx512vl();
      uVar19 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar28 = auVar5;
        auVar27 = vpbroadcastq_avx512vl();
        auVar27 = vpor_avx2(auVar27,auVar2);
        uVar21 = vpcmpuq_avx512vl(auVar27,auVar26,2);
        uVar21 = uVar21 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(*plVar13 + uVar19 * 8));
        auVar22 = vpgatherqd_avx512vl(*(undefined8 *)(uVar20 + 0x40));
        auVar23._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar22._4_4_;
        auVar23._0_4_ = (uint)((byte)uVar21 & 1) * auVar22._0_4_;
        auVar23._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar22._8_4_;
        auVar23._12_4_ = (uint)(byte)(uVar21 >> 3) * auVar22._12_4_;
        auVar23 = vpaddd_avx(auVar23,auVar28._0_16_);
        uVar19 = uVar19 + 4;
        auVar5 = ZEXT1664(auVar23);
      } while (uVar20 != uVar19);
      auVar23 = vmovdqa32_avx512vl(auVar23);
      bVar1 = (bool)((byte)uVar21 & 1);
      auVar22._0_4_ = (uint)bVar1 * auVar23._0_4_ | (uint)!bVar1 * auVar28._0_4_;
      bVar1 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar1 * auVar23._4_4_ | (uint)!bVar1 * auVar28._4_4_;
      bVar1 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar1 * auVar23._8_4_ | (uint)!bVar1 * auVar28._8_4_;
      bVar1 = SUB81(uVar21 >> 3,0);
      auVar22._12_4_ = (uint)bVar1 * auVar23._12_4_ | (uint)!bVar1 * auVar28._12_4_;
      auVar23 = vphaddd_avx(auVar22,auVar22);
      auVar23 = vphaddd_avx(auVar23,auVar23);
      vcvtdq2pd_avx(auVar23);
    }
    printf("Init average l: %lf\n");
    if (0 < local_28c) {
      lVar16 = 0;
      do {
        pDVar8 = local_1d8 + lVar16;
        lVar17 = 0;
        do {
          (*(code *)**(undefined8 **)__node_gen[lVar17]._M_h)(__node_gen[lVar17]._M_h,pDVar8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 6);
        lVar16 = lVar16 + 1;
      } while (lVar16 < local_28c);
    }
    iVar6 = local_204;
    plVar13 = *(long **)(local_200 + 0x70);
    iVar7 = *(int *)((long)plVar13 + 0xc) * (int)plVar13[1];
    if (0 < iVar7) {
      uVar20 = (ulong)(iVar7 + 3U & 0xfffffffc);
      auVar26 = vpbroadcastq_avx512vl();
      uVar19 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar23 = ZEXT816(0);
      do {
        auVar22 = auVar23;
        auVar27 = vpbroadcastq_avx512vl();
        auVar27 = vpor_avx2(auVar27,auVar2);
        uVar21 = vpcmpuq_avx512vl(auVar27,auVar26,2);
        uVar21 = uVar21 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(*plVar13 + uVar19 * 8));
        auVar23 = vpgatherqd_avx512vl(*(undefined8 *)(uVar20 + 0x40));
        auVar24._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar23._4_4_;
        auVar24._0_4_ = (uint)((byte)uVar21 & 1) * auVar23._0_4_;
        auVar24._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar23._8_4_;
        auVar24._12_4_ = (uint)(byte)(uVar21 >> 3) * auVar23._12_4_;
        auVar23 = vpaddd_avx(auVar24,auVar22);
        uVar19 = uVar19 + 4;
      } while (uVar20 != uVar19);
      auVar23 = vmovdqa32_avx512vl(auVar23);
      bVar1 = (bool)((byte)uVar21 & 1);
      auVar25._0_4_ = (uint)bVar1 * auVar23._0_4_ | (uint)!bVar1 * auVar22._0_4_;
      bVar1 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar1 * auVar23._4_4_ | (uint)!bVar1 * auVar22._4_4_;
      bVar1 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar1 * auVar23._8_4_ | (uint)!bVar1 * auVar22._8_4_;
      bVar1 = SUB81(uVar21 >> 3,0);
      auVar25._12_4_ = (uint)bVar1 * auVar23._12_4_ | (uint)!bVar1 * auVar22._12_4_;
      auVar23 = vphaddd_avx(auVar25,auVar25);
      auVar23 = vphaddd_avx(auVar23,auVar23);
      vcvtdq2pd_avx(auVar23);
    }
    printf("After average l: %lf\n");
    lVar16 = 0;
    do {
      this = (Abstract<4U> *)__node_gen[lVar16]._M_h;
      Abstract<4U>::Check(this,(HashMap<4U> *)local_1c8,iVar6,
                          (vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                           *)local_228);
      (*this->_vptr_Abstract[9])(this);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 6);
    uVar4 = local_228._8_8_;
    for (ppbVar18 = (pointer)local_228._0_8_; ppbVar18 != (pointer)uVar4; ppbVar18 = ppbVar18 + 1) {
      cVar3 = (char)*ppbVar18;
      std::ios::widen((char)*(undefined8 *)(*(long *)*ppbVar18 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    __node_gen = __node_gen + 6;
  } while (local_1d0 != 6);
  if (local_1d8 != (Data<4U> *)0x0) {
    operator_delete(local_1d8,4);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1c8);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  return;
}

Assistant:

void Frequent_BenchCmp(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchCmp\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 6;
	int heap_size = 2500, K = 2000;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK(mp, K);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new WavingSketch<8, 16, DATA_LEN>(memory / (8 * 8 + 16 * 2));
		sketches[i][2] = new SS<DATA_LEN>(memory / 100);
		sketches[i][3] = new USS<DATA_LEN>(memory / 100);
		sketches[i][4] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][5] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_F1.csv");

	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->Check(mp, topK, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}